

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  int local_84;
  void *pvStack_80;
  int out_size;
  void *out;
  byte local_61;
  LogMessage local_60;
  uint local_24;
  void *pvStack_20;
  int size_local;
  void *data_local;
  CopyingOutputStreamAdaptor *this_local;
  
  local_24 = size;
  pvStack_20 = data;
  data_local = this;
  if (size < this->buffer_size_) {
    while (uVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                             (this,&stack0xffffffffffffff80,&local_84), (uVar2 & 1) != 0) {
      if ((int)local_24 <= local_84) {
        memcpy(pvStack_80,pvStack_20,(long)(int)local_24);
        (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                  (this,(ulong)(local_84 - local_24));
        return true;
      }
      memcpy(pvStack_80,pvStack_20,(long)local_84);
      pvStack_20 = (void *)((long)pvStack_20 + (long)local_84);
      local_24 = local_24 - local_84;
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Flush(this);
    if ((bVar1) &&
       (uVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,pvStack_20,(ulong)local_24), (uVar2 & 1) != 0)) {
      local_61 = 0;
      if (this->buffer_used_ != 0) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x15e);
        local_61 = 1;
        other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer_used_) == (0): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&out + 3),other);
      }
      if ((local_61 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_60);
      }
      this->position_ = (long)(int)local_24 + this->position_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    GOOGLE_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}